

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>::
     Finalize<duckdb::interval_t,duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *state,
               interval_t *target,AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  reference pvVar2;
  undefined8 *in_RSI;
  vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_> *in_RDI;
  interval_t iVar3;
  Interpolator<true> interp;
  QuantileBindData *bind_data;
  size_type in_stack_ffffffffffffff98;
  FunctionData *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa8 [16];
  interval_t *in_stack_ffffffffffffffb8;
  Interpolator<true> *in_stack_ffffffffffffffc0;
  AggregateFinalizeData *in_stack_ffffffffffffffe0;
  undefined1 desc_p;
  
  bVar1 = std::vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>::empty
                    (in_stack_ffffffffffffffa8._8_8_);
  if (bVar1) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffe0);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffffa0);
    FunctionData::Cast<duckdb::QuantileBindData>(in_stack_ffffffffffffffa0);
    pvVar2 = vector<duckdb::QuantileValue,_true>::operator[]
                       ((vector<duckdb::QuantileValue,_true> *)in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff98);
    desc_p = (undefined1)((ulong)pvVar2 >> 0x38);
    std::vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>::size(in_RDI);
    Interpolator<true>::Interpolator
              (in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_,
               (idx_t)in_stack_ffffffffffffffa0,(bool)desc_p);
    std::vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>::data
              ((vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_> *)0xa46985);
    iVar3 = Interpolator<true>::
            Operation<duckdb::interval_t,duckdb::interval_t,duckdb::QuantileDirect<duckdb::interval_t>>
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                       in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_);
    *in_RSI = iVar3._0_8_;
    in_RSI[1] = iVar3.micros;
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		Interpolator<DISCRETE> interp(bind_data.quantiles[0], state.v.size(), bind_data.desc);
		target = interp.template Operation<typename STATE::InputType, T>(state.v.data(), finalize_data.result);
	}